

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

void Gia_ManSimPatWriteOne(FILE *pFile,word *pSim,int nWords)

{
  uint uVar1;
  int nDigits;
  int Digit;
  int k;
  int nWords_local;
  word *pSim_local;
  FILE *pFile_local;
  
  for (nDigits = 0; nDigits < nWords << 4; nDigits = nDigits + 1) {
    uVar1 = (uint)(pSim[nDigits / 0x10] >> ((byte)(nDigits % 0x10 << 2) & 0x3f)) & 0xf;
    if (uVar1 < 10) {
      fprintf((FILE *)pFile,"%d",(ulong)uVar1);
    }
    else {
      fprintf((FILE *)pFile,"%c",(ulong)(uVar1 + 0x37));
    }
  }
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

static inline void Gia_ManSimPatWriteOne( FILE * pFile, word * pSim, int nWords )
{
    int k, Digit, nDigits = nWords*16;
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = (int)((pSim[k/16] >> ((k%16) * 4)) & 15);
        if ( Digit < 10 )
            fprintf( pFile, "%d", Digit );
        else
            fprintf( pFile, "%c", 'A' + Digit-10 );
    }
    fprintf( pFile, "\n" );
}